

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_server.cpp
# Opt level: O1

void __thiscall
cab_server::cab_server
          (cab_server *this,application *application,io_service *io_service,uint16_t port)

{
  ostream *poVar1;
  data_union local_38;
  
  this->_application = application;
  this->_io_service = io_service;
  local_38._8_4_ = 0;
  local_38._12_4_ = 0;
  local_38._16_4_ = 0;
  local_38._20_8_ = 0;
  local_38.v4.sin_port = port << 8 | port >> 8;
  local_38.base.sa_family = 2;
  local_38.v6.sin6_flowinfo = 0;
  boost::asio::
  basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_socket_acceptor<boost::asio::io_context>
            (&this->_acceptor,io_service,(endpoint_type *)&local_38.base,true,(type *)0x0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Cab server Listening on *:",0x1a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  return;
}

Assistant:

cab_server::cab_server(application& application, boost::asio::io_service& io_service, std::uint16_t port):
    _application(application),
    _io_service(io_service),
    _acceptor(io_service, boost::asio::ip::tcp::endpoint(boost::asio::ip::tcp::v4(), port))
{
    std::cout << "Cab server Listening on *:" << port << "\n";
}